

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O3

void __thiscall VRasterizer::rasterize(VRasterizer *this,VPath *path,FillRule fillRule,VRect *clip)

{
  model *pmVar1;
  SharedRle *this_00;
  undefined8 uVar2;
  Data *this_01;
  VRect *__n;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int __fd;
  vcow_ptr<VPath::VPathData> local_40;
  vcow_ptr<VPath::VPathData> local_38;
  VPath *__stat_loc;
  
  __n = clip;
  __stat_loc = path;
  init(this,(EVP_PKEY_CTX *)path);
  __fd = (int)__stat_loc;
  pmVar1 = (path->d).mModel;
  this_00 = (SharedRle *)
            (this->d).super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((pmVar1->mValue).m_elements.
      super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(pmVar1->mValue).m_elements.
               super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
               super__Vector_impl_data + 8)) {
    (path->d).mModel = (model *)0x0;
    SharedRle::wait(this_00,__stat_loc);
    this_00->_ready = false;
    this_00->_pending = true;
    local_40.mModel = (model *)0x0;
    local_38.mModel = (model *)this_00[1]._rle.d.mModel;
    this_00[1]._rle.d.mModel = (model *)pmVar1;
    vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_38);
    this_00[1]._mutex.super___mutex_base._M_mutex.__size[0x18] = fillRule;
    uVar2 = *(undefined8 *)&clip->x2;
    *(undefined8 *)((long)&this_00[1]._mutex.super___mutex_base._M_mutex + 8) = *(undefined8 *)clip;
    *(undefined8 *)((long)&this_00[1]._mutex.super___mutex_base._M_mutex + 0x10) = uVar2;
    this_00[1]._mutex.super___mutex_base._M_mutex.__size[0x1b] = '\0';
    vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_40);
    updateRequest(this);
    return;
  }
  SharedRle::wait(this_00,__stat_loc);
  this_01 = (Data *)vcow_ptr<VRle::Data>::write
                              ((vcow_ptr<VRle::Data> *)this_00,__fd,
                               (void *)CONCAT44(extraout_var,extraout_EDX),(size_t)__n);
  VRle::Data::reset(this_01);
  return;
}

Assistant:

void VRasterizer::rasterize(VPath path, FillRule fillRule, const VRect &clip)
{
    init();
    if (path.empty()) {
        d->rle().reset();
        return;
    }
    d->task().update(std::move(path), fillRule, clip);
    updateRequest();
}